

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O1

void __thiscall
chrono::ChBodyEasyBox::SetupBody
          (ChBodyEasyBox *this,double Xsize,double Ysize,double Zsize,double density,bool visualize,
          bool collide,shared_ptr<chrono::ChMaterialSurface> *material)

{
  element_type *peVar1;
  ChBoxShape *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined7 in_register_00000011;
  ChFrame<double> *iner;
  shared_ptr<chrono::ChBoxShape> vshape;
  shared_ptr<chrono::ChVisualModel> local_110;
  shared_ptr<chrono::ChVisualShape> local_100;
  ChBoxShape *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  double local_d0;
  ChQuaternion<double> local_c8;
  ChFrame<double> local_a8;
  
  local_d0 = Xsize * Ysize * Zsize * density;
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,local_d0);
  local_a8.coord.pos.m_data[1] = local_d0 * 0.08333333333333333;
  local_a8._vptr_ChFrame =
       (_func_int **)((Ysize * Ysize + Zsize * Zsize) * local_a8.coord.pos.m_data[1]);
  local_a8.coord.pos.m_data[0] = (Xsize * Xsize + Zsize * Zsize) * local_a8.coord.pos.m_data[1];
  local_a8.coord.pos.m_data[1] = (Xsize * Xsize + Ysize * Ysize) * local_a8.coord.pos.m_data[1];
  iner = &local_a8;
  ChBody::SetInertiaXX(&this->super_ChBody,(ChVector<double> *)iner);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0xdc,
                    "void chrono::ChBodyEasyBox::SetupBody(double, double, double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[3])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_e0 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
    local_d8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_d8->_M_use_count = local_d8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_d8->_M_use_count = local_d8->_M_use_count + 1;
      }
    }
    local_c8.m_data[0] = 0.0;
    local_c8.m_data[1] = 0.0;
    local_c8.m_data[2] = 0.0;
    local_a8.coord.pos.m_data[0] = 0.0;
    local_a8.coord.pos.m_data[1] = 0.0;
    local_a8.coord.pos.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[1] = 0.0;
    local_a8.coord.rot.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[3] = 0.0;
    local_a8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
    local_a8.coord.rot.m_data[0] = 1.0;
    local_a8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    (*peVar1->_vptr_ChCollisionModel[7])(peVar1,&local_e0);
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[4])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    iner = (ChFrame<double> *)0x1;
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    this_00 = (ChBoxShape *)ChVisualShape::operator_new((ChVisualShape *)0x48,(size_t)iner);
    ChBoxShape::ChBoxShape(this_00);
    local_f0 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBoxShape*>
              (&local_e8,this_00);
    (local_f0->gbox).Size.m_data[0] = Xsize * 0.5;
    (local_f0->gbox).Size.m_data[1] = Ysize * 0.5;
    (local_f0->gbox).Size.m_data[2] = Zsize * 0.5;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._M_use_count = 0;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    local_100.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_f0->super_ChVisualShape;
    local_100.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_e8._M_pi;
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
      }
    }
    local_c8.m_data[0] = 1.0;
    local_c8.m_data[1] = 0.0;
    local_c8.m_data[2] = 0.0;
    local_c8.m_data[3] = 0.0;
    local_a8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_a8.coord.pos.m_data[0] = 0.0;
    local_a8.coord.pos.m_data[1] = 0.0;
    local_a8.coord.pos.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[0] = 1.0;
    local_a8.coord.rot.m_data[1] = 0.0;
    local_a8.coord.rot.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_a8.Amatrix,&local_c8);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var2 + 1),&local_100,&local_a8);
    if (local_100.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    local_110.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var2 + 1);
    local_110.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var2;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_110);
    if (local_110.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
  }
  return;
}

Assistant:

void ChBodyEasyBox::SetupBody(double Xsize,
                              double Ysize,
                              double Zsize,
                              double density,
                              bool visualize,
                              bool collide,
                              std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * (Xsize * Ysize * Zsize);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>((1.0 / 12.0) * mmass * (pow(Ysize, 2) + pow(Zsize, 2)),
                                  (1.0 / 12.0) * mmass * (pow(Xsize, 2) + pow(Zsize, 2)),
                                  (1.0 / 12.0) * mmass * (pow(Xsize, 2) + pow(Ysize, 2))));
    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddBox(material, Xsize * 0.5, Ysize * 0.5, Zsize * 0.5);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChBoxShape>();
        vshape->GetBoxGeometry().SetLengths(ChVector<>(Xsize, Ysize, Zsize));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}